

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O1

bool __thiscall
JsUtil::ReadOnlyList<JITJavascriptString_*,_Memory::JitArenaAllocator,_DefaultComparer>::Contains
          (ReadOnlyList<JITJavascriptString_*,_Memory::JitArenaAllocator,_DefaultComparer> *this,
          JITJavascriptString **item)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = 0 < this->count;
  if ((0 < this->count) &&
     (bVar1 = Js::JavascriptStringHelpers<JITJavascriptString>::Equals(*item,*this->buffer), !bVar1)
     ) {
    lVar2 = 1;
    do {
      bVar3 = lVar2 < this->count;
      if (this->count <= lVar2) {
        return bVar3;
      }
      bVar1 = Js::JavascriptStringHelpers<JITJavascriptString>::Equals(*item,this->buffer[lVar2]);
      lVar2 = lVar2 + 1;
    } while (!bVar1);
  }
  return bVar3;
}

Assistant:

bool Contains(const T& item) const
        {
            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(item, buffer[i]))
                {
                    return true;
                }
            }
            return false;
        }